

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.c
# Opt level: O1

int main(int argc,char **argv)

{
  void *__buf;
  bool bVar1;
  int iVar2;
  uint uVar3;
  light_pcapng_stream p_Var4;
  light_pcapng p_Var5;
  void *__ptr;
  char *__s;
  char *pcVar6;
  uint32_t *__buf_00;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  char **ppcVar12;
  ulong uVar13;
  char trace_path [4096];
  uint local_1094;
  uint32_t *local_1090;
  int local_1088;
  size_t local_1068;
  int local_105c;
  char *local_1058;
  char **local_1050;
  ulong local_1048;
  char *local_1040;
  char local_1038 [4104];
  
  local_1094 = 0;
  local_1050 = argv;
  while( true ) {
    do {
      while (iVar2 = getopt(argc,argv,"n:t:b:f:c"), 0x65 < iVar2) {
        if ((iVar2 != 0x66) && (iVar2 != 0x74)) {
          if (iVar2 != 0x6e) goto LAB_001029cb;
          local_1094 = atoi(_optarg);
          printf("Set packet limit to %d\n",(ulong)local_1094);
        }
      }
    } while (iVar2 == 0x62);
    if (iVar2 != 99) break;
    pcVar11 = argv[_optind];
    if (pcVar11 != (char *)0x0) {
      ppcVar12 = argv + _optind;
      do {
        iVar2 = access(pcVar11,4);
        if (iVar2 == 0) {
          p_Var4 = light_open_stream(*ppcVar12);
          if (p_Var4 == (light_pcapng_stream)0x0) {
            main_cold_1();
            uVar13 = 0;
          }
          else {
            uVar13 = 0;
            do {
              uVar13 = (ulong)((int)uVar13 + 1);
              p_Var5 = light_read_stream(p_Var4);
            } while (p_Var5 != (light_pcapng)0x0);
          }
          light_close_stream(p_Var4);
          printf("--> %s has %u blocks\n",*ppcVar12,uVar13);
        }
        pcVar11 = ppcVar12[1];
        ppcVar12 = ppcVar12 + 1;
        argv = local_1050;
      } while (pcVar11 != (char *)0x0);
    }
  }
  if (iVar2 == -1) {
    if (1 < argc && local_1094 != 0) {
      uVar13 = 1;
      do {
        iVar2 = access(argv[uVar13],4);
        if (iVar2 == 0) {
          pcVar11 = argv[uVar13];
          __ptr = calloc(1,8);
          memset(local_1038,0,0x1000);
          __s = strdup(pcVar11);
          pcVar6 = strrchr(__s,0x2e);
          *pcVar6 = '\0';
          local_1040 = pcVar11;
          p_Var4 = light_open_stream(pcVar11);
          if (p_Var4 == (light_pcapng_stream)0x0) {
            free(__ptr);
            free(__s);
          }
          else {
            sprintf(local_1038,"%s_%04d.pcapng",__s,0);
            iVar2 = open(local_1038,0x42,0x1b6);
            if (iVar2 == -1) {
              fprintf(_stderr,"Unable to open file for write: %s\n",local_1038);
              free(__ptr);
              free(__s);
              light_close_stream(p_Var4);
            }
            else {
              local_1088 = 1;
              uVar3 = 0;
              uVar10 = 0;
              local_1090 = (uint32_t *)0x0;
              local_105c = iVar2;
              local_1058 = __s;
              local_1048 = uVar13;
              do {
                local_1068 = 0;
                p_Var5 = light_read_stream(p_Var4);
                __buf_00 = light_pcapng_to_memory(p_Var5,&local_1068);
                if (__buf_00 != (uint32_t *)0x0) {
                  iVar9 = (int)uVar10;
                  if (*__buf_00 == 1) {
                    if (iVar9 == local_1088) {
                      local_1088 = local_1088 * 2;
                      __ptr = realloc(__ptr,(long)local_1088);
                    }
                    *(uint32_t **)((long)__ptr + (long)iVar9 * 8) = __buf_00;
                    uVar10 = (ulong)(iVar9 + 1);
                    bVar1 = false;
                  }
                  else if (*__buf_00 == 0xa0d0d0a) {
                    if (local_1090 != (uint32_t *)0x0) {
                      if (0 < iVar9) {
                        uVar13 = 0;
                        do {
                          free(*(void **)((long)__ptr + uVar13 * 8));
                          *(undefined8 *)((long)__ptr + uVar13 * 8) = 0;
                          uVar13 = uVar13 + 1;
                        } while (uVar10 != uVar13);
                      }
                      free(local_1090);
                      uVar10 = 0;
                    }
                    __buf_00[4] = 0xffffffff;
                    __buf_00[5] = 0xffffffff;
                    bVar1 = false;
                    local_1090 = __buf_00;
                  }
                  else {
                    uVar3 = uVar3 + 1;
                    bVar1 = true;
                  }
                  sVar7 = write(iVar2,__buf_00,local_1068);
                  if (sVar7 != local_1068) {
                    fprintf(_stderr,
                            "Warning: write error occurred for %s: failed to write %zu bytes\n.",
                            local_1038);
                  }
                  if (bVar1) {
                    free(__buf_00);
                  }
                  if (uVar3 == local_1094) {
                    close(iVar2);
                    sprintf(local_1038,"%s_%04d.pcapng",local_1058);
                    iVar2 = open(local_1038,0x42,0x1b6);
                    uVar13 = write(iVar2,local_1090,(ulong)local_1090[1]);
                    if (uVar13 != local_1090[1]) {
                      fprintf(_stderr,
                              "Warning: write error occurred for %s: failed to write %u bytes\n.",
                              local_1038);
                    }
                    uVar3 = 0;
                    if (0 < (int)uVar10) {
                      uVar13 = 0;
                      do {
                        __buf = *(void **)((long)__ptr + uVar13 * 8);
                        uVar8 = write(iVar2,__buf,(ulong)*(uint *)((long)__buf + 4));
                        if (uVar8 != *(uint *)(*(long *)((long)__ptr + uVar13 * 8) + 4)) {
                          fprintf(_stderr,
                                  "Warning: write error occurred for %s: failed to write %u bytes\n."
                                  ,local_1038);
                        }
                        uVar13 = uVar13 + 1;
                        argv = local_1050;
                      } while (uVar10 != uVar13);
                    }
                  }
                }
              } while (__buf_00 != (uint32_t *)0x0);
              printf("Split %s into %d files.\n",local_1040,(ulong)((iVar2 - local_105c) + 1));
              free(local_1058);
              close(iVar2);
              if (0 < (int)uVar10) {
                uVar13 = 0;
                do {
                  free(*(void **)((long)__ptr + uVar13 * 8));
                  uVar13 = uVar13 + 1;
                } while (uVar10 != uVar13);
              }
              free(__ptr);
              free(local_1090);
              light_close_stream(p_Var4);
              uVar13 = local_1048;
            }
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uint)argc);
    }
    return 0;
  }
LAB_001029cb:
  exit(1);
}

Assistant:

int main(int argc, char * const argv[]) {
	// TODO: split trace in N intervals.
	// TODO: split trace in N bytes size.
	// ...
	// TODO: split trace using histogram function.
	int option = 0;
	int n = 0;

	while ((option = getopt(argc, argv, "n:t:b:f:c")) != -1) {
		switch (option) {
		case 'n':
			n = atoi(optarg);
			printf("Set packet limit to %d\n", n);
			break;
		case 't':
			break;
		case 'b':
			break;
		case 'f':
			break;
		case 'c':
			test_split_count(argc - optind, &argv[optind]);
			break;
		default:
			exit(EXIT_FAILURE);
		}
	}

	if (n != 0) {
		int i;
		for (i = 1; i < argc; ++i) {
			if (access(argv[i], F_OK | R_OK) == 0) {
				test_split_trace(n, argv[i]);
			}
		}
	}

	return 0;
}